

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

Frame * __thiscall mkvparser::Block::GetFrame(Block *this,int idx)

{
  Frame *f;
  int idx_local;
  Block *this_local;
  
  return this->m_frames + idx;
}

Assistant:

const Block::Frame& Block::GetFrame(int idx) const {
  assert(idx >= 0);
  assert(idx < m_frame_count);

  const Frame& f = m_frames[idx];
  assert(f.pos > 0);
  assert(f.len > 0);

  return f;
}